

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O0

axbStatus_t
axbScalarCreate(axbHandle_s *handle,axbScalar_s **scalar,void *value,axbDataType_t datatype,
               axbMemBackend_s *mem)

{
  axbMemBackend_s *mem_local;
  axbDataType_t datatype_local;
  void *value_local;
  axbScalar_s **scalar_local;
  axbHandle_s *handle_local;
  
  axbScalarCreateBegin(handle,scalar);
  axbScalarSetDataType(*scalar,datatype);
  axbScalarSetMemBackend(*scalar,mem);
  axbScalarCreateEnd(*scalar);
  axbScalarSetValue(*scalar,value,datatype);
  return 0;
}

Assistant:

axbStatus_t axbScalarCreate(struct axbHandle_s *handle, struct axbScalar_s **scalar, void *value, axbDataType_t datatype, struct axbMemBackend_s *mem)
{
  axbScalarCreateBegin(handle, scalar);
  axbScalarSetDataType(*scalar, datatype);
  axbScalarSetMemBackend(*scalar, mem);
  axbScalarCreateEnd(*scalar);
  axbScalarSetValue(*scalar, value, datatype);
  return 0;
}